

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre
               (EventLogEntry *evt,Var funcVar,UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  charcount_t length;
  JsRTCallFunctionAction *pJVar2;
  JavascriptFunction *this;
  JavascriptString *this_00;
  char16 *str;
  JavascriptString *displayName;
  JsRTCallFunctionAction *cfAction;
  UnlinkableSlabAllocator *alloc_local;
  Var funcVar_local;
  EventLogEntry *evt_local;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  bVar1 = Js::VarIs<Js::JavascriptFunction>(funcVar);
  if (bVar1) {
    this = Js::VarTo<Js::JavascriptFunction>(funcVar);
    this_00 = Js::JavascriptFunction::GetDisplayName(this);
    str = Js::JavascriptString::GetString(this_00);
    length = Js::JavascriptString::GetLength(this_00);
    SlabAllocatorBase<8>::CopyStringIntoWLength(alloc,str,length,&pJVar2->FunctionName);
  }
  else {
    SlabAllocatorBase<8>::CopyNullTermStringInto(alloc,L"#not a function#",&pJVar2->FunctionName);
  }
  pJVar2->LastNestedEvent = 0x7fffffffffffffff;
  return;
}

Assistant:

void JsRTCallFunctionAction_ProcessDiagInfoPre(EventLogEntry* evt, Js::Var funcVar, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            if(Js::VarIs<Js::JavascriptFunction>(funcVar))
            {
                Js::JavascriptString* displayName = Js::VarTo<Js::JavascriptFunction>(funcVar)->GetDisplayName();
                alloc.CopyStringIntoWLength(displayName->GetString(), displayName->GetLength(), cfAction->FunctionName);
            }
            else
            {
                alloc.CopyNullTermStringInto(_u("#not a function#"), cfAction->FunctionName);
            }

            //In case we don't terminate add these nicely
            cfAction->LastNestedEvent = TTD_EVENT_MAXTIME;
        }